

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::Boxed_Number::oper(Boxed_Number *this,Opers t_oper,Boxed_Value *t_lhs)

{
  Common_Types CVar1;
  bad_any_cast *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  type tVar3;
  Boxed_Value BVar4;
  
  CVar1 = get_common_type(t_lhs);
  switch(CVar1) {
  case t_int32:
    tVar3 = go<int>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_double:
    tVar3 = go<double>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint8:
    tVar3 = go<unsigned_char>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int8:
    tVar3 = go<signed_char>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint16:
    tVar3 = go<unsigned_short>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int16:
    tVar3 = go<short>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint32:
    tVar3 = go<unsigned_int>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_uint64:
    tVar3 = go<unsigned_long>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_int64:
    tVar3 = go<long>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_float:
    tVar3 = go<float>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  case t_long_double:
    tVar3 = go<long_double>(this,t_oper,t_lhs);
    _Var2._M_pi = tVar3.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    break;
  default:
    this_00 = (bad_any_cast *)__cxa_allocate_exception(0x28);
    detail::exception::bad_any_cast::bad_any_cast(this_00);
    __cxa_throw(this_00,&detail::exception::bad_any_cast::typeinfo,
                detail::exception::bad_any_cast::~bad_any_cast);
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline static Boxed_Value oper(Operators::Opers t_oper, const Boxed_Value &t_lhs)
        {
          switch (get_common_type(t_lhs)) {
            case Common_Types::t_int32:
              return go<int32_t>(t_oper, t_lhs);
            case Common_Types::t_uint8:
              return go<uint8_t>(t_oper, t_lhs);
            case Common_Types::t_int8:
              return go<int8_t>(t_oper, t_lhs);
            case Common_Types::t_uint16:
              return go<uint16_t>(t_oper, t_lhs);
            case Common_Types::t_int16:
              return go<int16_t>(t_oper, t_lhs);
            case Common_Types::t_uint32:
              return go<uint32_t>(t_oper, t_lhs);
            case Common_Types::t_uint64:
              return go<uint64_t>(t_oper, t_lhs);
            case Common_Types::t_int64:
              return go<int64_t>(t_oper, t_lhs);
            case Common_Types::t_double:
              return go<double>(t_oper, t_lhs);
            case Common_Types::t_float:
              return go<float>(t_oper, t_lhs);
            case Common_Types::t_long_double:
              return go<long double>(t_oper, t_lhs);
          }

          throw chaiscript::detail::exception::bad_any_cast();
        }